

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiNavLayer IVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *in_RSI;
  ImGuiID in_EDI;
  ImRect IVar3;
  ImGuiNavLayer nav_layer;
  ImGuiContext *g;
  ImRect *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  ImVec2 local_24;
  
  pIVar2 = GImGui;
  if (GImGui->NavWindow != in_RSI) {
    SetNavWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  IVar1 = (in_RSI->DC).NavLayerCurrent;
  pIVar2->NavId = in_EDI;
  pIVar2->NavLayer = IVar1;
  SetNavFocusScope((ImGuiID)((ulong)in_RSI >> 0x20));
  in_RSI->NavLastIds[IVar1] = in_EDI;
  if ((pIVar2->LastItemData).ID == in_EDI) {
    IVar3 = WindowRectAbsToRel((ImGuiWindow *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd4 = IVar3.Min.x;
    local_24 = IVar3.Max;
    in_RSI->NavRectRel[IVar1].Min = IVar3.Min;
    (&in_RSI->NavRectRel[IVar1].Min)[1] = local_24;
  }
  if ((pIVar2->ActiveIdSource == ImGuiInputSource_Keyboard) ||
     (pIVar2->ActiveIdSource == ImGuiInputSource_Gamepad)) {
    pIVar2->NavDisableMouseHover = true;
  }
  else {
    pIVar2->NavDisableHighlight = true;
  }
  NavClearPreferredPosForAxis((ImGuiAxis)in_stack_ffffffffffffffd4);
  NavClearPreferredPosForAxis((ImGuiAxis)in_stack_ffffffffffffffd4);
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    if (g.NavWindow != window)
       SetNavWindow(window);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and g.CurrentFocusScopeId are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    g.NavId = id;
    g.NavLayer = nav_layer;
    SetNavFocusScope(g.CurrentFocusScopeId);
    window->NavLastIds[nav_layer] = id;
    if (g.LastItemData.ID == id)
        window->NavRectRel[nav_layer] = WindowRectAbsToRel(window, g.LastItemData.NavRect);

    if (g.ActiveIdSource == ImGuiInputSource_Keyboard || g.ActiveIdSource == ImGuiInputSource_Gamepad)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;

    // Clear preferred scoring position (NavMoveRequestApplyResult() will tend to restore it)
    NavClearPreferredPosForAxis(ImGuiAxis_X);
    NavClearPreferredPosForAxis(ImGuiAxis_Y);
}